

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log<char*>(logger *this,source_loc loc,level_enum lvl,string_view_t fmt,char **args)

{
  string_view_t a_logger_name;
  source_loc loc_00;
  iterator iVar1;
  char *s;
  size_t count;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_RDI;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  logger *in_stack_fffffffffffffd48;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffd50;
  string_view_t in_stack_fffffffffffffd58;
  buffer<char> *this_01;
  allocator<char> *args_00;
  basic_string_view<char> *format_str;
  basic_string_view<char> local_208 [2];
  char *local_1e8;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_1e0;
  log_msg *local_1d8;
  buffer<char> *local_170;
  allocator<char> local_151;
  buffer<char> local_150 [9];
  undefined1 local_2a;
  byte local_29;
  
  format_str = (basic_string_view<char> *)&stack0x00000008;
  local_29 = should_log(in_stack_fffffffffffffd48,
                        (level_enum)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  local_2a = details::backtracer::enabled((backtracer *)0x113b9b);
  if (((local_29 & 1) != 0) || ((bool)local_2a)) {
    args_00 = &local_151;
    std::allocator<char>::allocator();
    ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd40,(allocator<char> *)in_stack_fffffffffffffd38);
    std::allocator<char>::~allocator(&local_151);
    iVar1 = ::fmt::v6::format_to<fmt::v6::basic_string_view<char>,char*const&,250ul,char>
                      (in_RDI,format_str,(char **)args_00);
    local_1d8 = (log_msg *)format_str[1].data_;
    local_1e8 = format_str->data_;
    pbStack_1e0 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)format_str->size_;
    local_170 = iVar1.container;
    ::fmt::v6::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    this_01 = local_150;
    s = ::fmt::v6::internal::buffer<char>::data(this_01);
    count = ::fmt::v6::internal::buffer<char>::size(this_01);
    ::fmt::v6::basic_string_view<char>::basic_string_view(local_208,s,count);
    loc_00._8_8_ = args_00;
    loc_00.filename = (char *)iVar1.container;
    loc_00.funcname = (char *)format_str;
    a_logger_name.size_ = (size_t)s;
    a_logger_name.data_ = (char *)this_01;
    this_00 = pbStack_1e0;
    log_msg_00 = local_1d8;
    details::log_msg::log_msg
              ((log_msg *)in_stack_fffffffffffffd50,loc_00,a_logger_name,
               (level_enum)((ulong)local_1d8 >> 0x20),in_stack_fffffffffffffd58);
    log_it_(in_stack_fffffffffffffd50,log_msg_00,SUB81((ulong)this_00 >> 0x38,0),
            SUB81((ulong)this_00 >> 0x30,0));
    ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (this_00);
  }
  return;
}

Assistant:

void log(source_loc loc, level::level_enum lvl, string_view_t fmt, const Args &... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, args...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }